

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyJsonNameTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  Descriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  FieldDescriptor *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_01;
  int i;
  int index;
  int iVar1;
  LogMessage LStack_38;
  
  iVar1 = this->message_type_count_;
  if ((iVar1 == *(int *)((long)&proto->field_0 + 0x28)) &&
     (this->extension_count_ == *(int *)((long)&proto->field_0 + 0x70))) {
    for (index = 0; index < iVar1; index = index + 1) {
      this_00 = message_type(this,index);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,index)
      ;
      Descriptor::CopyJsonNameTo(this_00,proto_00);
      iVar1 = this->message_type_count_;
    }
    for (iVar1 = 0; iVar1 < this->extension_count_; iVar1 = iVar1 + 1) {
      this_01 = extension(this,iVar1);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                           (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar1);
      FieldDescriptor::CopyJsonNameTo(this_01,proto_01);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc72);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_38,(char (*) [54])"Cannot copy json_name to a proto of a different size.");
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_38);
  }
  return;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol<ParentNameFieldQuery>(this, name);
}